

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall
QRasterPaintEngine::drawPoints(QRasterPaintEngine *this,QPointF *points,int pointCount)

{
  long lVar1;
  QCosmeticStroker *this_00;
  QRasterPaintEngineState *s_00;
  undefined4 in_EDX;
  QCosmeticStroker *in_RDI;
  long in_FS_OFFSET;
  QRasterPaintEngineState *s;
  QRasterPaintEnginePrivate *d;
  QCosmeticStroker stroker;
  QRect *in_stack_ffffffffffffef28;
  undefined4 in_stack_ffffffffffffef48;
  undefined1 local_10a0 [140];
  int in_stack_ffffffffffffefec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QCosmeticStroker *)d_func((QRasterPaintEngine *)0x5735d9);
  s_00 = state((QRasterPaintEngine *)0x5735e8);
  ensurePen((QRasterPaintEngine *)in_RDI);
  if ((s_00->penData).blend != (ProcessSpans)0x0) {
    if ((*(ushort *)&s_00->field_12 >> 1 & 1) == 0) {
      QPaintEngineEx::drawPoints
                ((QPaintEngineEx *)CONCAT44(in_EDX,in_stack_ffffffffffffef48),(QPointF *)this_00,
                 in_stack_ffffffffffffefec);
    }
    else {
      memcpy(local_10a0,&DAT_00bb9b48,0x1098);
      QCosmeticStroker::QCosmeticStroker(this_00,s_00,(QRect *)in_RDI,in_stack_ffffffffffffef28);
      QCosmeticStroker::drawPoints
                ((QCosmeticStroker *)CONCAT44(in_EDX,in_stack_ffffffffffffef48),(QPointF *)this_00,
                 (int)((ulong)s_00 >> 0x20));
      QCosmeticStroker::~QCosmeticStroker(in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRasterPaintEngine::drawPoints(const QPointF *points, int pointCount)
{
    Q_D(QRasterPaintEngine);
    QRasterPaintEngineState *s = state();

    ensurePen();
    if (!s->penData.blend)
        return;

    if (!s->flags.fast_pen) {
        QPaintEngineEx::drawPoints(points, pointCount);
        return;
    }

    QCosmeticStroker stroker(s, d->deviceRect, d->deviceRectUnclipped);
    stroker.drawPoints(points, pointCount);
}